

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

bool __thiscall
ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock
          (ON_SerialNumberMap *this,ON_SN_BLOCK *blk)

{
  uint uVar1;
  SN_ELEMENT **ppSVar2;
  SN_ELEMENT *pSVar3;
  SN_ELEMENT *pSVar4;
  uint uVar5;
  SN_ELEMENT **ppSVar6;
  ulong uVar7;
  ON__UINT32 OVar8;
  SN_ELEMENT *pSVar9;
  
  if (this->m_bHashTableIsValid != '\0') {
    uVar7 = this->m_active_id_count;
    OVar8 = blk->m_count;
    if (OVar8 << 7 < uVar7) {
      if (OVar8 == 0) {
        return true;
      }
      pSVar4 = blk->m_sn;
      uVar1 = this->m_hash_block_count;
      do {
        if (pSVar4->m_id_active != '\0') {
          uVar5 = pSVar4->m_id_crc32;
          ppSVar2 = this->m_hash_table_blocks[(ulong)uVar5 % (ulong)uVar1];
          uVar5 = uVar5 / 0xffa + (uVar5 / 0xff4024) * -0xffa;
          pSVar3 = ppSVar2[uVar5];
          if (pSVar3 != (SN_ELEMENT *)0x0) {
            if (pSVar3 == pSVar4) {
              pSVar9 = (SN_ELEMENT *)0x0;
            }
            else {
              do {
                pSVar9 = pSVar3;
                pSVar3 = pSVar9->m_next;
                if (pSVar3 == (SN_ELEMENT *)0x0) goto LAB_004d10dc;
              } while (pSVar3 != pSVar4);
            }
            uVar7 = uVar7 - 1;
            this->m_active_id_count = uVar7;
            ppSVar6 = &pSVar9->m_next;
            if (pSVar9 == (SN_ELEMENT *)0x0) {
              ppSVar6 = ppSVar2 + uVar5;
            }
            *ppSVar6 = pSVar3->m_next;
          }
        }
LAB_004d10dc:
        OVar8 = OVar8 - 1;
        pSVar4 = pSVar4 + 1;
        if (OVar8 == 0) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock(const ON_SN_BLOCK* blk)
{
  // quickly remove every id in the block from the hash table.
  // This is done when the block is small compared to the
  // size of the hash table and removing the elements from
  // the hash table, rearranging the block, and then adding
  // the elements back into the hash table is faster than
  // simply rebuilding the hash table.
  //
  // The 128 multiplier is determined as follows:
  // - C = average number of elements with the same hash index
  //     = m_active_id_count/m_hash_capacity.
  // - D = cost of destroying hash table = time to memset the table
  //       to zero.
  // - H = cost of calculating the hash table index of an id.
  // - A = The cost of adding an element to the hash table is
  //       H + two pointer assignments with is essentially H.
  // - F = The average cost of finding an element in the hash
  //       table is H plus going through half the linked list
  //       of elements at that hash index (C/2 pointer dereferences).
  // - B = number of elements in a block.
  // - I = (number times a valid hash table is destroyed)/
  //       (number of times the hash table is rebuilt).
  // - R = rebuild cost = A*m_active_id_count.
  // - Keeping the the has table up to date only makes sense if
  //   R > I*(A+F)*active_id_count
  //   it is needed often enough to justify ...
  bool rc = false;
  if ( m_bHashTableIsValid && m_active_id_count > 128*blk->m_count )
  {
    const SN_ELEMENT* e;
    struct SN_ELEMENT** hash_table_block;
    SN_ELEMENT* h;
    SN_ELEMENT* prev;
    ON__UINT32 i;
    rc = true;
    for (e = blk->m_sn, i = blk->m_count; i--; e++)
    {
      if ( 0 == e->m_id_active )
        continue;
      hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
      ON__UINT32 hash_i = Internal_HashTableBlockRowIndex(e->m_id_crc32);
      prev = 0;
      for ( h = hash_table_block[hash_i]; nullptr !=  h; h = h->m_next )
      {
        if (h == e)
        {
          // Do not change value of SN_ELEMENT's m_id_active.
          // This value is needed by AddBlockToHashTableHelper()
          // when it add the element back in.
          m_active_id_count--;
          if (prev)
            prev->m_next = h->m_next;
          else
            hash_table_block[hash_i] = h->m_next;
          break;
        }
        prev = h;
      }
    }
  }
  return rc;
}